

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (UnknownFieldLiteParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte *ptr_00;
  uint uVar2;
  long lVar3;
  pair<const_char_*,_bool> pVar4;
  
  while( true ) {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar4 = EpsCopyInputStream::DoneFallback(&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_)
      ;
      ptr = pVar4.first;
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    uVar2 = (uint)bVar1;
    ptr_00 = (byte *)ptr + 1;
    if ((char)bVar1 < '\0') {
      uVar2 = ((uint)bVar1 + (uint)*ptr_00 * 0x80) - 0x80;
      if ((char)*ptr_00 < '\0') {
        ptr_00 = (byte *)ptr + 3;
        lVar3 = -0x15;
        while (uVar2 = (ptr_00[-1] - 1 << ((char)lVar3 + 0x23U & 0x1f)) + uVar2,
              (char)ptr_00[-1] < '\0') {
          ptr_00 = ptr_00 + 1;
          lVar3 = lVar3 + 7;
          if (lVar3 == 0) {
            return (char *)0x0;
          }
        }
      }
      else {
        ptr_00 = (byte *)ptr + 2;
      }
    }
    if ((uVar2 == 0) || ((uVar2 & 7) == 4)) break;
    ptr = FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                    ((ulong)uVar2,field_parser,(char *)ptr_00,ctx);
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  }
  (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar2 - 1;
  return (char *)ptr_00;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* WireFormatParser(T& field_parser,
                                                      const char* ptr,
                                                      ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32 tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}